

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O3

long __thiscall rapic::scan::get_header_integer(scan *this,char *name)

{
  header *phVar1;
  int iVar2;
  long lVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  header *h;
  header *this_01;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  this_01 = (this->headers_).super__Vector_base<rapic::header,_std::allocator<rapic::header>_>.
            _M_impl.super__Vector_impl_data._M_start;
  phVar1 = (this->headers_).super__Vector_base<rapic::header,_std::allocator<rapic::header>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_01 == phVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"missing mandatory header ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_68);
      local_48 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_48 == plVar5) {
        local_38 = *plVar5;
        lStack_30 = plVar4[3];
        local_48 = &local_38;
      }
      else {
        local_38 = *plVar5;
      }
      local_40 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::__cxx11::string::compare((char *)this_01);
    if (iVar2 == 0) break;
    this_01 = this_01 + 1;
  }
  lVar3 = header::get_integer(this_01);
  return lVar3;
}

Assistant:

auto scan::get_header_integer(char const* name) const -> long
{
  if (auto p = find_header(name))
    return p->get_integer();
  throw std::runtime_error{std::string("missing mandatory header ") + name};
}